

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O0

void __thiscall
moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo_*,_moodycamel::ConcurrentQueueDefaultTraits>
::populate_initial_implicit_producer_hash
          (ConcurrentQueue<loop::MessageLoop::TaskInfo_*,_moodycamel::ConcurrentQueueDefaultTraits>
           *this)

{
  reference pvVar1;
  size_type local_60;
  size_t i;
  ImplicitProducerHash *hash;
  ConcurrentQueue<loop::MessageLoop::TaskInfo_*,_moodycamel::ConcurrentQueueDefaultTraits>
  *this_local;
  memory_order __b_1;
  memory_order __b;
  
  std::operator&(memory_order_relaxed,__memory_order_mask);
  (this->implicitProducerHashCount).super___atomic_base<unsigned_long>._M_i = 0;
  (this->initialImplicitProducerHash).capacity = 0x20;
  pvVar1 = std::
           array<moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo_*,_moodycamel::ConcurrentQueueDefaultTraits>::ImplicitProducerKVP,_32UL>
           ::operator[](&this->initialImplicitProducerHashEntries,0);
  (this->initialImplicitProducerHash).entries = pvVar1;
  for (local_60 = 0; local_60 != 0x20; local_60 = local_60 + 1) {
    pvVar1 = std::
             array<moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo_*,_moodycamel::ConcurrentQueueDefaultTraits>::ImplicitProducerKVP,_32UL>
             ::operator[](&this->initialImplicitProducerHashEntries,local_60);
    std::operator&(memory_order_relaxed,__memory_order_mask);
    (pvVar1->key).super___atomic_base<unsigned_long>._M_i = 0;
  }
  (this->initialImplicitProducerHash).prev = (ImplicitProducerHash *)0x0;
  std::
  atomic<moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo_*,_moodycamel::ConcurrentQueueDefaultTraits>::ImplicitProducerHash_*>
  ::store(&this->implicitProducerHash,&this->initialImplicitProducerHash,memory_order_relaxed);
  return;
}

Assistant:

inline void populate_initial_implicit_producer_hash()
	{
		if (INITIAL_IMPLICIT_PRODUCER_HASH_SIZE == 0) return;
		
		implicitProducerHashCount.store(0, std::memory_order_relaxed);
		auto hash = &initialImplicitProducerHash;
		hash->capacity = INITIAL_IMPLICIT_PRODUCER_HASH_SIZE;
		hash->entries = &initialImplicitProducerHashEntries[0];
		for (size_t i = 0; i != INITIAL_IMPLICIT_PRODUCER_HASH_SIZE; ++i) {
			initialImplicitProducerHashEntries[i].key.store(details::invalid_thread_id, std::memory_order_relaxed);
		}
		hash->prev = nullptr;
		implicitProducerHash.store(hash, std::memory_order_relaxed);
	}